

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O3

bool duckdb::SkipToCloseQuotes(StringCastInputState *input_state)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  byte bVar7;
  
  pcVar3 = input_state->buf;
  puVar4 = input_state->pos;
  puVar5 = input_state->len;
  uVar6 = *puVar4;
  cVar1 = pcVar3[uVar6];
  bVar7 = input_state->escaped;
  do {
    uVar6 = uVar6 + 1;
    *puVar4 = uVar6;
    if (*puVar5 <= uVar6) {
      return false;
    }
    cVar2 = pcVar3[uVar6];
    if (cVar2 == '\\') {
      bVar7 = bVar7 ^ 1;
    }
    else {
      if ((cVar2 == cVar1) && ((bVar7 & 1) == 0)) {
        return true;
      }
      bVar7 = false;
    }
    input_state->escaped = (bool)bVar7;
  } while( true );
}

Assistant:

static bool SkipToCloseQuotes(StringCastInputState &input_state) {
	auto &buf = input_state.buf;
	auto &pos = input_state.pos;
	auto &len = input_state.len;
	auto &escaped = input_state.escaped;

	char quote = buf[pos];
	pos++;

	while (pos < len) {
		bool set_escaped = false;
		if (buf[pos] == '\\') {
			if (!escaped) {
				set_escaped = true;
			}
		} else {
			if (buf[pos] == quote && !escaped) {
				return true;
			}
		}
		escaped = set_escaped;
		pos++;
	}
	return false;
}